

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_psk_key_exchange_modes_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  int iVar1;
  CBB ke_modes;
  CBB contents;
  CBB CStack_68;
  CBB local_38;
  
  if ((hs->max_version < 0x304) ||
     ((hs->pake_prover)._M_t.
      super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl != (Prover *)0x0)) {
    return true;
  }
  iVar1 = CBB_add_u16(out_compressible,0x2d);
  if ((((iVar1 != 0) &&
       (iVar1 = CBB_add_u16_length_prefixed(out_compressible,&local_38), iVar1 != 0)) &&
      (iVar1 = CBB_add_u8_length_prefixed(&local_38,&CStack_68), iVar1 != 0)) &&
     (iVar1 = CBB_add_u8(&CStack_68,'\x01'), iVar1 != 0)) {
    iVar1 = CBB_flush(out_compressible);
    return iVar1 != 0;
  }
  return false;
}

Assistant:

static bool ext_psk_key_exchange_modes_add_clienthello(
    const SSL_HANDSHAKE *hs, CBB *out, CBB *out_compressible,
    ssl_client_hello_type_t type) {
  if (hs->max_version < TLS1_3_VERSION) {
    return true;
  }
  // We do not support resumption with PAKEs, so do not offer any PSK key
  // exchange modes, to signal the server not to send a ticket.
  if (hs->pake_prover != nullptr) {
    return true;
  }

  CBB contents, ke_modes;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_psk_key_exchange_modes) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u8_length_prefixed(&contents, &ke_modes) ||
      !CBB_add_u8(&ke_modes, SSL_PSK_DHE_KE)) {
    return false;
  }

  return CBB_flush(out_compressible);
}